

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

bool __thiscall Catch::clara::TextFlow::Column::iterator::isBoundary(iterator *this,size_t at)

{
  bool bVar1;
  ulong uVar2;
  size_t sVar3;
  string *psVar4;
  char *pcVar5;
  bool local_29;
  size_t at_local;
  iterator *this_local;
  
  if (at == 0) {
    __assert_fail("at > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/Neargye[P]scope_guard/test/3rdparty/Catch2/catch.hpp"
                  ,0x213b,"bool Catch::clara::TextFlow::Column::iterator::isBoundary(size_t) const")
    ;
  }
  line_abi_cxx11_(this);
  uVar2 = ::std::__cxx11::string::size();
  if (at <= uVar2) {
    line_abi_cxx11_(this);
    sVar3 = ::std::__cxx11::string::size();
    local_29 = true;
    if (at != sVar3) {
      psVar4 = line_abi_cxx11_(this);
      pcVar5 = (char *)::std::__cxx11::string::operator[]((ulong)psVar4);
      bVar1 = isWhitespace(*pcVar5);
      if (bVar1) {
        psVar4 = line_abi_cxx11_(this);
        pcVar5 = (char *)::std::__cxx11::string::operator[]((ulong)psVar4);
        bVar1 = isWhitespace(*pcVar5);
        if (!bVar1) {
          return true;
        }
      }
      psVar4 = line_abi_cxx11_(this);
      pcVar5 = (char *)::std::__cxx11::string::operator[]((ulong)psVar4);
      bVar1 = isBreakableBefore(*pcVar5);
      local_29 = true;
      if (!bVar1) {
        psVar4 = line_abi_cxx11_(this);
        pcVar5 = (char *)::std::__cxx11::string::operator[]((ulong)psVar4);
        local_29 = isBreakableAfter(*pcVar5);
      }
    }
    return local_29;
  }
  __assert_fail("at <= line().size()",
                "/workspace/llm4binary/github/license_c_cmakelists/Neargye[P]scope_guard/test/3rdparty/Catch2/catch.hpp"
                ,0x213c,"bool Catch::clara::TextFlow::Column::iterator::isBoundary(size_t) const");
}

Assistant:

auto isBoundary(size_t at) const -> bool {
			assert(at > 0);
			assert(at <= line().size());

			return at == line().size() ||
				(isWhitespace(line()[at]) && !isWhitespace(line()[at - 1])) ||
				isBreakableBefore(line()[at]) ||
				isBreakableAfter(line()[at - 1]);
		}